

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::ShaderSubroutine::FunctionalTest14_15::testDefaultSubroutineSet
          (FunctionalTest14_15 *this,vec4<unsigned_int> *uni_input,
          vec4<unsigned_int> *expected_routine_1_result,
          vec4<unsigned_int> *expected_routine_2_result)

{
  ostringstream *poVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  FunctionalTest14_15 *pFVar10;
  bool bVar11;
  int iVar12;
  deUint32 dVar13;
  undefined4 extraout_var;
  uint *puVar15;
  double __x;
  double __x_00;
  vec4<unsigned_int> routine_2_result;
  vec4<unsigned_int> routine_1_result;
  MessageBuilder message;
  vec4<unsigned_int> local_1e0;
  vec4<unsigned_int> local_1d0;
  FunctionalTest14_15 *local_1c0;
  vec4<unsigned_int> *local_1b8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar14;
  
  local_1b8 = expected_routine_1_result;
  iVar12 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar14 = CONCAT44(extraout_var,iVar12);
  local_1c0 = this;
  (**(code **)(lVar14 + 0x15c0))
            (this->m_uniform_location,uni_input->m_x,uni_input->m_y,uni_input->m_z,uni_input->m_w);
  dVar13 = (**(code **)(lVar14 + 0x800))();
  glu::checkError(dVar13,"Uniform4f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x1e47);
  (**(code **)(lVar14 + 0x30))(0);
  dVar13 = (**(code **)(lVar14 + 0x800))();
  glu::checkError(dVar13,"BeginTransformFeedback",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x1e4b);
  (**(code **)(lVar14 + 0x538))(0,0,1);
  dVar13 = (**(code **)(lVar14 + 0x800))();
  glu::checkError(dVar13,"DrawArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x1e4e);
  (**(code **)(lVar14 + 0x638))();
  dVar13 = (**(code **)(lVar14 + 0x800))();
  glu::checkError(dVar13,"EndTransformFeedback",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x1e51);
  puVar15 = (uint *)(**(code **)(lVar14 + 0xcf8))(0x8c8e,35000);
  dVar13 = (**(code **)(lVar14 + 0x800))();
  glu::checkError(dVar13,"MapBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x1e55);
  uVar2 = *puVar15;
  uVar3 = puVar15[1];
  uVar4 = puVar15[2];
  uVar5 = puVar15[3];
  uVar6 = puVar15[4];
  uVar7 = puVar15[5];
  uVar8 = puVar15[6];
  uVar9 = puVar15[7];
  local_1e0.m_x = uVar6;
  local_1e0.m_y = uVar7;
  local_1e0.m_z = uVar8;
  local_1e0.m_w = uVar9;
  local_1d0.m_x = uVar2;
  local_1d0.m_y = uVar3;
  local_1d0.m_z = uVar4;
  local_1d0.m_w = uVar5;
  (**(code **)(lVar14 + 0x1670))(0x8c8e);
  dVar13 = (**(code **)(lVar14 + 0x800))();
  glu::checkError(dVar13,"UnmapBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x1e66);
  pFVar10 = local_1c0;
  if ((((((uVar2 != local_1b8->m_x) || (uVar3 != local_1b8->m_y)) || (uVar4 != local_1b8->m_z)) ||
       (uVar5 != local_1b8->m_w)) &&
      (((uVar2 != local_1b8[1].m_x || (uVar3 != local_1b8[1].m_y)) ||
       ((uVar4 != local_1b8[1].m_z || (uVar5 != local_1b8[1].m_w)))))) ||
     ((((uVar6 != expected_routine_2_result->m_x || (uVar7 != expected_routine_2_result->m_y)) ||
       ((uVar8 != expected_routine_2_result->m_z ||
        (bVar11 = true, uVar9 != expected_routine_2_result->m_w)))) &&
      ((((uVar6 != expected_routine_2_result[1].m_x || (uVar7 != expected_routine_2_result[1].m_y))
        || (uVar8 != expected_routine_2_result[1].m_z)) ||
       (bVar11 = true, uVar9 != expected_routine_2_result[1].m_w)))))) {
    local_1b0._0_8_ = ((local_1c0->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Error. Invalid result.",0x16);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    local_1b0._0_8_ = ((pFVar10->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Routine_1, result: ",0x13)
    ;
    Utils::vec4<unsigned_int>::log(&local_1d0,__x);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Routine_2, result: ",0x13)
    ;
    Utils::vec4<unsigned_int>::log(&local_1e0,__x_00);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    bVar11 = false;
  }
  return bVar11;
}

Assistant:

bool FunctionalTest14_15::testDefaultSubroutineSet(const Utils::vec4<glw::GLuint>& uni_input,
												   const Utils::vec4<glw::GLuint>  expected_routine_1_result[2],
												   const Utils::vec4<glw::GLuint>  expected_routine_2_result[2]) const
{
	const glw::Functions& gl	 = m_context.getRenderContext().getFunctions();
	bool				  result = true;

	/* Set up input data uniforms */
	gl.uniform4ui(m_uniform_location, uni_input.m_x, uni_input.m_y, uni_input.m_z, uni_input.m_w);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform4f");

	/* Execute draw call with transform feedback */
	gl.beginTransformFeedback(GL_POINTS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BeginTransformFeedback");

	gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DrawArrays");

	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "EndTransformFeedback");

	/* Capture results */
	GLuint* feedback_data = (GLuint*)gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "MapBuffer");

	Utils::vec4<GLuint> routine_1_result;
	Utils::vec4<GLuint> routine_2_result;

	routine_1_result.m_x = feedback_data[0 + 0];
	routine_1_result.m_y = feedback_data[0 + 1];
	routine_1_result.m_z = feedback_data[0 + 2];
	routine_1_result.m_w = feedback_data[0 + 3];

	routine_2_result.m_x = feedback_data[4 + 0];
	routine_2_result.m_y = feedback_data[4 + 1];
	routine_2_result.m_z = feedback_data[4 + 2];
	routine_2_result.m_w = feedback_data[4 + 3];

	/* Unmap buffer */
	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UnmapBuffer");

	/* Verifiy */
	result = result &&
			 ((routine_1_result == expected_routine_1_result[0]) || (routine_1_result == expected_routine_1_result[1]));

	result = result &&
			 ((routine_2_result == expected_routine_2_result[0]) || (routine_2_result == expected_routine_2_result[1]));

	/* Log error if any */
	if (false == result)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Error. Invalid result."
											<< tcu::TestLog::EndMessage;

		tcu::MessageBuilder message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

		message << "Routine_1, result: ";

		routine_1_result.log(message);

		message << "Routine_2, result: ";

		routine_2_result.log(message);

		message << tcu::TestLog::EndMessage;
	}

	/* Done */
	return result;
}